

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

void __thiscall
Js::DynamicProfileInfo::RecordPolymorphicCallSiteInfo
          (DynamicProfileInfo *this,FunctionBody *functionBody,ProfileId callSiteId,
          FunctionInfo *calleeFunctionInfo)

{
  BOOL BVar1;
  LocalFunctionId curFunctionId;
  FunctionProxy *this_00;
  ScriptContext *pSVar2;
  ScriptContext *pSVar3;
  DWORD_PTR DVar4;
  DWORD_PTR DVar5;
  SourceId local_3c;
  SourceId sourceId;
  FunctionProxy *calleeFunctionProxy;
  LocalFunctionId functionId;
  FunctionInfo *calleeFunctionInfo_local;
  ProfileId callSiteId_local;
  FunctionBody *functionBody_local;
  DynamicProfileInfo *this_local;
  
  if ((calleeFunctionInfo == (FunctionInfo *)0x0) ||
     (BVar1 = FunctionInfo::HasBody(calleeFunctionInfo), BVar1 == 0)) {
    ResetPolymorphicCallSiteInfo(this,callSiteId,0xffffffff);
  }
  else {
    this_00 = FunctionInfo::GetFunctionProxy(calleeFunctionInfo);
    pSVar2 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
    pSVar3 = FunctionProxy::GetScriptContext(this_00);
    if (pSVar2 == pSVar3) {
      DVar4 = FunctionProxy::GetSecondaryHostSourceContext((FunctionProxy *)functionBody);
      DVar5 = FunctionProxy::GetSecondaryHostSourceContext(this_00);
      if (DVar4 == DVar5) {
        DVar4 = FunctionProxy::GetHostSourceContext(this_00);
        local_3c = (SourceId)DVar4;
        DVar5 = FunctionProxy::GetHostSourceContext((FunctionProxy *)functionBody);
        if (DVar5 == (DVar4 & 0xffffffff)) {
          local_3c = 0xfffffffd;
        }
        curFunctionId = FunctionProxy::GetLocalFunctionId(this_00);
        SetFunctionIdSlotForNewPolymorphicCall(this,callSiteId,curFunctionId,local_3c,functionBody);
        return;
      }
    }
    ResetPolymorphicCallSiteInfo(this,callSiteId,0xfffffffe);
  }
  return;
}

Assistant:

void DynamicProfileInfo::RecordPolymorphicCallSiteInfo(FunctionBody* functionBody, ProfileId callSiteId, FunctionInfo * calleeFunctionInfo)
    {
        Js::LocalFunctionId functionId;
        if (calleeFunctionInfo == nullptr || !calleeFunctionInfo->HasBody())
        {
            return ResetPolymorphicCallSiteInfo(callSiteId, CallSiteMixed);
        }

        // We can only inline function that are from the same script context. So only record that data
        // We're about to call this function so deserialize it right now.
        FunctionProxy* calleeFunctionProxy = calleeFunctionInfo->GetFunctionProxy();

        if (functionBody->GetScriptContext() == calleeFunctionProxy->GetScriptContext())
        {
            if (functionBody->GetSecondaryHostSourceContext() == calleeFunctionProxy->GetSecondaryHostSourceContext())
            {
                Js::SourceId sourceId = (Js::SourceId)calleeFunctionProxy->GetHostSourceContext();
                if (functionBody->GetHostSourceContext() == sourceId)  // if caller and callee in same file
                {
                    sourceId = CurrentSourceId;
                }
                functionId = calleeFunctionProxy->GetLocalFunctionId();
                SetFunctionIdSlotForNewPolymorphicCall(callSiteId, functionId, sourceId, functionBody);
                return;
            }
        }

        // Pretend that we are cross context when call is crossing script file.
        ResetPolymorphicCallSiteInfo(callSiteId, CallSiteCrossContext);
    }